

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_streams.cpp
# Opt level: O2

ssize_t __thiscall BitWriter::write(BitWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong in_RAX;
  int iVar2;
  size_t i;
  void *pvVar3;
  
  for (pvVar3 = (void *)0x0; __buf != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
    uVar1 = (uint)(((uint)__fd >> ((uint)pvVar3 & 0x1f) & 1) != 0) << ((byte)this->_curBit & 0x1f);
    in_RAX = (ulong)uVar1;
    this->_buf = this->_buf | (byte)uVar1;
    iVar2 = this->_curBit + 1;
    this->_curBit = iVar2;
    if (iVar2 == 8) {
      in_RAX = std::ostream::write((char *)this->_os,(long)&this->_buf);
      this->_curBit = 0;
      this->_buf = '\0';
    }
  }
  return in_RAX;
}

Assistant:

void BitWriter::write(int data, std::size_t length) {
    for (std::size_t i = 0; i < length; ++i) {
        int bit = (data >> i) & 1;
        _buf |= (bit << _curBit);
        _curBit++;
        if (_curBit == BITS_IN_BYTE) {
            _os.write((const char*)&_buf, 1);
            _curBit = 0;
            _buf = 0;
        }
    }
}